

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal
          (ChElementBeamTaperedTimoshenko *this,ChMatrixRef *H,double Kfactor,double Rfactor,
          double Mfactor)

{
  double *pdVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  variable_if_dynamic<long,__1> vVar7;
  DstXprType *pDVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  SrcEvaluatorType *pSVar11;
  pointer psVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ChMatrixDynamic<> *pCVar21;
  double dVar22;
  Matrix<double,_3,_3,_1,_3,_3> *pMVar23;
  ChElementBeamTaperedTimoshenko *pCVar24;
  assign_op<double,_double> *paVar25;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  CVar26;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  CVar27;
  int iVar28;
  ChMatrix33<double> *pCVar29;
  ChMatrix33<double> *pCVar30;
  char *pcVar31;
  double *pdVar32;
  long lVar33;
  assign_op<double,_double> *paVar34;
  element_type *peVar35;
  long lVar36;
  long lVar37;
  ChMatrixDynamic<> *pCVar38;
  undefined1 *puVar39;
  DstXprType *pDVar40;
  ChMatrix33<double> *pCVar41;
  long lVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChMatrixDynamic<> CKCt;
  ActualDstType actualDst;
  ChMatrixDynamic<> CRCt;
  ChMatrixDynamic<> CK;
  ChMatrixDynamic<> CR;
  SrcEvaluatorType srcEvaluator;
  ChVectorDynamic<> displ;
  DstEvaluatorType dstEvaluator_2;
  ChMatrix33<double> AtolocwelB;
  ChVector<double> mWacc_A;
  ChVector<double> mWvel_A;
  SrcEvaluatorType srcEvaluator_1;
  DstEvaluatorType dstEvaluator;
  ChVector<double> mWvel_B;
  ChMatrix33<double> Atoabs;
  ChVector<double> mWacc_B;
  ChMatrix33<double> AtolocwelA;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_e00;
  DenseStorage<double,__1,__1,__1,_1> local_de0;
  ChElementBeamTaperedTimoshenko *local_dc0;
  assign_op<double,_double> *local_db8;
  undefined1 local_da9 [25];
  DenseStorage<double,__1,__1,__1,_1> local_d90;
  DenseStorage<double,__1,__1,__1,_1> local_d70;
  assign_op<double,_double> *local_d50;
  undefined8 uStack_d48;
  DenseStorage<double,__1,__1,__1,_1> local_d40;
  undefined1 local_d28 [16];
  assign_op<double,_double> *local_d18;
  DstXprType *local_d10;
  double local_d08;
  double local_d00;
  double local_cf8;
  ChMatrix33<double> *local_cf0;
  ChMatrixConstRef local_ce8;
  undefined8 local_cd8;
  ChMatrix33<double> local_cd0;
  undefined1 local_c88 [8];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_c80;
  ChMatrix33<double> local_c60;
  assign_op<double,_double> *local_c00;
  assign_op<double,_double> *paStack_bf8;
  undefined1 local_bf0 [16];
  undefined8 local_be0;
  undefined1 local_bd0 [16];
  undefined8 local_bc0;
  undefined1 local_bb8 [24];
  undefined1 local_ba0 [24];
  ChMatrixRef local_b88;
  ChMatrixRef local_b60;
  ChMatrixRef local_b38;
  ChMatrixRef local_b10;
  ChMatrixRef local_ae8;
  undefined1 local_ac0 [16];
  scalar_constant_op<double> sStack_ab0;
  scalar_constant_op<double> sStack_aa8;
  ChMatrixDynamic<> *pCStack_aa0;
  Matrix<double,__1,__1,_1,__1,__1> MStack_a98;
  assign_op<double,_double> *local_a80;
  assign_op<double,_double> *paStack_a78;
  undefined1 auStack_a70 [48];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [56];
  double dStack_648;
  undefined1 local_640 [32];
  assign_op<double,_double> *paStack_620;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> eStack_618;
  assign_op<double,_double> *paStack_610;
  double dStack_608;
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_188 [24];
  ChMatrix33<double> local_170;
  undefined1 local_128 [24];
  ChMatrix33<double> local_110;
  ChMatrixRef local_c8;
  ChMatrixRef local_a0 [2];
  
  CVar26 = _local_640;
  local_da9._9_8_ = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0xc) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0xc)) {
    __assert_fail("(H.rows() == 12) && (H.cols() == 12)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x338,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x339,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  local_dc0 = this;
  local_db8 = (assign_op<double,_double> *)H;
  if ((((Kfactor == 0.0) && (!NAN(Kfactor))) && (Rfactor == 0.0)) && (!NAN(Rfactor))) {
    local_ac0._8_8_ = local_d28;
    local_ac0._0_8_ = local_640;
    local_d28._0_8_ = (ChMatrix33<double> *)0x0;
    local_640._0_8_ =
         (LhsNested)
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    CVar27 = _local_640;
    sStack_ab0.m_other = (double)&local_cd0;
    stack0xfffffffffffff9d8 = CVar26._24_40_;
    local_640._0_16_ = CVar27._0_16_;
    local_640._16_8_ =
         (H->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    sStack_aa8.m_other = (double)H;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_ac0);
LAB_006700eb:
    if (((double)local_da9._9_8_ == 0.0) && (!NAN((double)local_da9._9_8_))) {
      return;
    }
    local_de0.m_data = (double *)0x0;
    local_de0.m_rows = 0;
    local_de0.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_de0,0x90,0xc,0xc);
    local_ac0._0_8_ = local_de0.m_rows;
    local_ac0._8_8_ = local_de0.m_cols;
    sStack_ab0.m_other = 0.0;
    if ((local_de0.m_cols | local_de0.m_rows) < 0) {
      pcVar31 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_00670d05;
    }
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_de0,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)local_ac0,(assign_op<double,_double> *)local_640);
    if (((this->tapered_section).
         super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->use_lumped_mass_matrix == true) {
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_da9._17_8_ = &this->M;
        pCVar38 = (ChMatrixDynamic<> *)0x18;
        lVar42 = 0;
        pDVar40 = (DstXprType *)0x0;
        local_d50 = (assign_op<double,_double> *)
                    ((this->super_ChElementBeam).length * 0.5 * (double)local_da9._9_8_);
        uStack_d48 = 0;
        local_c00 = local_d50;
        paStack_bf8 = local_d50;
        do {
          pCVar21 = (ChMatrixDynamic<> *)((long)pDVar40 * 6);
          pCVar29 = (ChMatrix33<double> *)((long)pDVar40 * 6 + 3);
          if (((((this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows < (long)pCVar29) ||
               (lVar33 = (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                         m_storage.m_cols, lVar33 < (long)pCVar29)) ||
              (local_de0.m_rows < (long)pCVar29)) || (local_de0.m_cols < (long)pCVar29)) {
LAB_00670b64:
            pcVar31 = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
            ;
LAB_00670b79:
            __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar31);
          }
          pdVar32 = (double *)
                    ((long)(this->M).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data + (lVar33 + 1) * lVar42 + 0x10);
          paVar34 = (assign_op<double,_double> *)
                    ((long)local_de0.m_data + (long)(local_de0.m_cols + 1) * lVar42 + 0x10);
          lVar36 = 3;
          do {
            dVar2 = pdVar32[-1];
            dVar22 = *(double *)(paVar34 + -8);
            *(double *)&paVar34[-0x10].field_0x0 =
                 (double)local_c00 * pdVar32[-2] + *(double *)&paVar34[-0x10].field_0x0;
            *(double *)(paVar34 + -8) = (double)paStack_bf8 * dVar2 + dVar22;
            dVar2 = *pdVar32;
            pdVar32 = pdVar32 + lVar33;
            *(double *)paVar34 = (double)local_d50 * dVar2 + *(double *)paVar34;
            paVar34 = paVar34 + local_de0.m_cols * 8;
            lVar36 = lVar36 + -1;
          } while (lVar36 != 0);
          puVar39 = (undefined1 *)
                    ((long)&(pCVar21->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                            m_storage.m_data + 6);
          if ((((local_dc0->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_rows < (long)puVar39) ||
              (lVar33 = (local_dc0->M).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar33 < (long)puVar39)) ||
             ((local_de0.m_rows < (long)puVar39 || (local_de0.m_cols < (long)puVar39))))
          goto LAB_00670b64;
          pdVar32 = (double *)
                    ((long)(local_dc0->M).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data + (lVar33 + 1) * (long)pCVar38 + 0x10);
          paVar34 = (assign_op<double,_double> *)
                    ((long)local_de0.m_data + (long)(local_de0.m_cols + 1) * (long)pCVar38 + 0x10);
          lVar36 = 3;
          do {
            dVar2 = pdVar32[-1];
            dVar22 = *(double *)(paVar34 + -8);
            *(double *)&paVar34[-0x10].field_0x0 =
                 (double)local_c00 * pdVar32[-2] + *(double *)&paVar34[-0x10].field_0x0;
            *(double *)(paVar34 + -8) = (double)paStack_bf8 * dVar2 + dVar22;
            dVar2 = *pdVar32;
            pdVar32 = pdVar32 + lVar33;
            *(double *)paVar34 = (double)local_d50 * dVar2 + *(double *)paVar34;
            paVar34 = paVar34 + local_de0.m_cols * 8;
            lVar36 = lVar36 + -1;
          } while (lVar36 != 0);
          local_da9._1_8_ = pCVar38;
          if (((local_dc0->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows < (long)pCVar29) ||
             (paVar34 = (assign_op<double,_double> *)
                        (local_dc0->M).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, (long)paVar34 < (long)puVar39)) goto LAB_00670b64;
          local_ac0._8_8_ =
               (local_dc0->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data +
               (long)((long)(pCVar29->super_Matrix<double,_3,_3,_1,_3,_3>).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + (long)paVar34 * (long)pCVar21);
          local_ac0._0_8_ =
               &((local_dc0->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pDVar40].
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->field_0x58;
          sStack_aa8.m_other = (double)local_da9._17_8_;
          local_da9._9_8_ = pDVar40;
          pCStack_aa0 = pCVar21;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data = (double *)pCVar29;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows = (Index)paVar34;
          local_a80 = local_d50;
          ChMatrix33<double>::operator=
                    ((ChMatrix33<double> *)local_d28,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                      *)local_ac0);
          if ((local_de0.m_rows < (long)pCVar29) || (local_de0.m_cols < (long)puVar39))
          goto LAB_00670b64;
          paVar34 = (assign_op<double,_double> *)
                    ((long)local_de0.m_data + local_de0.m_cols * lVar42);
          lVar33 = 0x10;
          do {
            dVar2 = *(double *)((long)&local_d40.m_cols + lVar33);
            dVar22 = *(double *)(paVar34 + lVar42 + 0x18 + 8);
            *(double *)(paVar34 + lVar42 + 0x18) =
                 *(double *)((long)&local_d40.m_rows + lVar33) +
                 *(double *)(paVar34 + lVar42 + 0x18);
            *(double *)(paVar34 + lVar42 + 0x18 + 8) = dVar2 + dVar22;
            pdVar32 = (double *)(local_d28 + lVar33);
            lVar33 = lVar33 + 0x18;
            *(double *)(paVar34 + lVar42 + 0x28) = *pdVar32 + *(double *)(paVar34 + lVar42 + 0x28);
            paVar34 = paVar34 + local_de0.m_cols * 8;
          } while (lVar33 != 0x58);
          if ((local_de0.m_rows < (long)puVar39) || (local_de0.m_cols < (long)pCVar29))
          goto LAB_00670b64;
          paVar34 = (assign_op<double,_double> *)
                    ((long)local_de0.m_data +
                    (long)pCVar29 * local_de0.m_cols * 8 + (long)pDVar40 * 0x30);
          if (((assign_op<double,_double> *)local_de0.m_data != (assign_op<double,_double> *)0x0) &&
             ((assign_op<double,_double> *)local_d28 == paVar34)) {
            __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                          "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 3, 3>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 3, 1>>, MightHaveTransposeAliasing = true]"
                         );
          }
          pDVar40 = (DstXprType *)
                    ((long)&(((RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                               *)local_da9._9_8_)->
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            ).
                            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                            .m_data + 1);
          lVar42 = lVar42 + 0x30;
          pCVar38 = (ChMatrixDynamic<> *)(local_da9._1_8_ + 0x30);
          *(double *)paVar34 = (double)local_d28._0_8_ + *(double *)paVar34;
          *(double *)(paVar34 + 8) = (double)local_d10 + *(double *)(paVar34 + 8);
          *(double *)(paVar34 + 0x10) = local_cf8 + *(double *)(paVar34 + 0x10);
          *(double *)(paVar34 + local_de0.m_cols * 8) =
               (double)local_d28._8_8_ + *(double *)(paVar34 + local_de0.m_cols * 8);
          *(double *)(paVar34 + local_de0.m_cols * 8 + 8) =
               local_d08 + *(double *)(paVar34 + local_de0.m_cols * 8 + 8);
          *(double *)(paVar34 + local_de0.m_cols * 8 + 0x10) =
               (double)local_cf0 + *(double *)(paVar34 + local_de0.m_cols * 8 + 0x10);
          lVar33 = local_de0.m_cols * 0x10;
          *(double *)(paVar34 + lVar33) = (double)local_d18 + *(double *)(paVar34 + lVar33);
          *(double *)(paVar34 + lVar33 + 8) = local_d00 + *(double *)(paVar34 + lVar33 + 8);
          *(double *)(paVar34 + lVar33 + 0x10) =
               (double)local_ce8 + *(double *)(paVar34 + lVar33 + 0x10);
          this = local_dc0;
        } while (pDVar40 < (DstXprType *)
                           ((long)(local_dc0->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_dc0->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      CVar26 = _local_640;
      local_ac0._0_8_ = *(undefined8 *)local_db8;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
           *(Index *)(local_db8 + 0x18);
      local_ac0._8_8_ = (assign_op<double,_double> *)0xc;
      sStack_ab0.m_other = 5.92878775009496e-323;
      sStack_aa8.m_other = (double)local_db8;
      pCStack_aa0 = (ChMatrixDynamic<> *)0x0;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      if (((long)*(double *)(local_db8 + 8) < 0xc) || ((long)*(double *)(local_db8 + 0x10) < 0xc)) {
LAB_00670c01:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_de0.m_data;
      local_170.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_de0.m_cols;
      if (((ChMatrix33<double> *)local_de0.m_rows != (ChMatrix33<double> *)0xc) ||
         ((assign_op<double,_double> *)local_de0.m_cols != (assign_op<double,_double> *)0xc)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      local_640._8_8_ = &local_170;
      local_640._0_8_ = &local_cd0;
      local_640._16_8_ = &local_110;
      _paStack_620 = CVar26._32_32_;
      local_640._24_8_ = (DstXprType *)local_ac0;
      local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_ac0._0_8_;
      local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)local_640);
LAB_00670af9:
      if ((assign_op<double,_double> *)local_de0.m_data != (assign_op<double,_double> *)0x0) {
        free(*(void **)((long)local_de0.m_data + -8));
      }
      return;
    }
    paVar34 = (assign_op<double,_double> *)
              (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols;
    pSVar11 = (SrcEvaluatorType *)
              (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_rows;
    if (-1 < (long)((ulong)paVar34 | (ulong)pSVar11)) {
      local_ac0._0_8_ = &this->M;
      sStack_aa8.m_other = (double)local_da9._9_8_;
      local_ac0._8_8_ = pSVar11;
      sStack_ab0.m_other = (double)paVar34;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)&local_de0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                  *)local_ac0,(assign_op<double,_double> *)local_640);
      ChMatrix33<double>::ChMatrix33(&local_cd0,&this->q_element_abs_rot);
      psVar12 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = (psVar12->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var14 = (psVar12->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      auVar43 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
      auVar15 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
      auVar71 = vpermpd_avx2(auVar43,1);
      auVar54._0_8_ = *(ulong *)&peVar13->field_0x40 ^ 0x8000000000000000;
      auVar54._8_8_ = *(ulong *)&peVar13->field_0x48 ^ 0x8000000000000000;
      auVar54._16_8_ = 0x8000000000000000;
      auVar54._24_8_ = 0x8000000000000000;
      uVar62 = *(ulong *)&peVar13->field_0x50 ^ 0x8000000000000000;
      auVar67._24_8_ = 0x8000000000000000;
      auVar67._16_8_ = uVar62;
      auVar16 = vpermpd_avx2(auVar54,0xd0);
      auVar81._8_8_ = uVar62;
      auVar81._0_8_ = uVar62;
      auVar81._16_8_ = uVar62;
      auVar81._24_8_ = uVar62;
      auVar67._0_16_ = *(undefined1 (*) [16])&peVar13->field_0x48;
      auVar60._16_8_ = *(ulong *)&peVar13->field_0x40;
      auVar60._0_16_ = *(undefined1 (*) [16])&peVar13->field_0x48;
      auVar60._24_8_ = 0;
      auVar52 = vpermpd_avx2(auVar54,0x11);
      auVar16 = vblendpd_avx(auVar16,ZEXT832(*(ulong *)&peVar13->field_0x40),1);
      auVar16 = vblendpd_avx(auVar16,auVar81,8);
      auVar65 = vpermpd_avx2(auVar67,0x24);
      auVar52 = vshufpd_avx(auVar60,auVar52,9);
      auVar77._0_8_ = auVar71._0_8_ * auVar16._0_8_;
      auVar77._8_8_ = auVar71._8_8_ * auVar16._8_8_;
      auVar77._16_8_ = auVar71._16_8_ * auVar16._16_8_;
      auVar77._24_8_ = auVar71._24_8_ * auVar16._24_8_;
      uVar3 = *(undefined8 *)&peVar13->field_0x38;
      auVar18._8_8_ = uVar3;
      auVar18._0_8_ = uVar3;
      auVar18._16_8_ = uVar3;
      auVar18._24_8_ = uVar3;
      auVar43 = vfmadd231pd_avx512vl(auVar77,auVar43,auVar18);
      dVar2 = (this->q_element_abs_rot).m_data[2];
      auVar73._8_8_ = dVar2;
      auVar73._0_8_ = dVar2;
      dVar2 = (this->q_element_abs_rot).m_data[1];
      auVar73._24_8_ = dVar2;
      auVar73._16_8_ = dVar2;
      auVar17 = vfmadd213pd_fma(auVar73,auVar65,auVar43);
      auVar17 = vfmadd213pd_fma(auVar52,auVar15,ZEXT1632(auVar17));
      local_ac0._0_8_ = auVar17._0_8_;
      local_ac0._8_8_ = auVar17._8_8_;
      sStack_ab0.m_other = 0.0;
      sStack_aa8.m_other = 0.0;
      ChMatrix33<double>::ChMatrix33(&local_170,(ChQuaternion<double> *)local_ac0);
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      psVar12 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar13 = psVar12[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = psVar12[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      auVar43 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
      auVar15 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
      auVar71 = vpermpd_avx2(auVar43,1);
      auVar55._0_8_ = *(ulong *)&peVar13->field_0x40 ^ 0x8000000000000000;
      auVar55._8_8_ = *(ulong *)&peVar13->field_0x48 ^ 0x8000000000000000;
      auVar55._16_8_ = 0x8000000000000000;
      auVar55._24_8_ = 0x8000000000000000;
      uVar62 = *(ulong *)&peVar13->field_0x50 ^ 0x8000000000000000;
      auVar68._24_8_ = 0x8000000000000000;
      auVar68._16_8_ = uVar62;
      auVar16 = vpermpd_avx2(auVar55,0xd0);
      auVar82._8_8_ = uVar62;
      auVar82._0_8_ = uVar62;
      auVar82._16_8_ = uVar62;
      auVar82._24_8_ = uVar62;
      auVar68._0_16_ = *(undefined1 (*) [16])&peVar13->field_0x48;
      auVar61._16_8_ = *(ulong *)&peVar13->field_0x40;
      auVar61._0_16_ = *(undefined1 (*) [16])&peVar13->field_0x48;
      auVar61._24_8_ = 0;
      auVar52 = vpermpd_avx2(auVar55,0x11);
      auVar16 = vblendpd_avx(auVar16,ZEXT832(*(ulong *)&peVar13->field_0x40),1);
      auVar16 = vblendpd_avx(auVar16,auVar82,8);
      auVar65 = vpermpd_avx2(auVar68,0x24);
      auVar52 = vshufpd_avx(auVar61,auVar52,9);
      auVar78._0_8_ = auVar71._0_8_ * auVar16._0_8_;
      auVar78._8_8_ = auVar71._8_8_ * auVar16._8_8_;
      auVar78._16_8_ = auVar71._16_8_ * auVar16._16_8_;
      auVar78._24_8_ = auVar71._24_8_ * auVar16._24_8_;
      uVar3 = *(undefined8 *)&peVar13->field_0x38;
      auVar19._8_8_ = uVar3;
      auVar19._0_8_ = uVar3;
      auVar19._16_8_ = uVar3;
      auVar19._24_8_ = uVar3;
      auVar43 = vfmadd231pd_avx512vl(auVar78,auVar43,auVar19);
      dVar2 = (this->q_element_abs_rot).m_data[2];
      auVar74._8_8_ = dVar2;
      auVar74._0_8_ = dVar2;
      dVar2 = (this->q_element_abs_rot).m_data[1];
      auVar74._24_8_ = dVar2;
      auVar74._16_8_ = dVar2;
      auVar17 = vfmadd213pd_fma(auVar74,auVar65,auVar43);
      auVar17 = vfmadd213pd_fma(auVar52,auVar15,ZEXT1632(auVar17));
      local_ac0._0_8_ = auVar17._0_8_;
      local_ac0._8_8_ = auVar17._8_8_;
      sStack_ab0.m_other = 0.0;
      sStack_aa8.m_other = 0.0;
      ChMatrix33<double>::ChMatrix33(&local_110,(ChQuaternion<double> *)local_ac0);
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
      local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
      local_ac0._0_8_ = &local_cd0;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_e00,(iterator)0x0,(ChMatrix33<double> **)local_ac0);
      if (local_e00.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_e00.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_ac0._0_8_ = &local_170;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_e00,
                   (iterator)
                   local_e00.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
      }
      else {
        *local_e00.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_170;
        local_e00.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e00.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      paVar34 = local_db8;
      if (local_e00.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_e00.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_ac0._0_8_ = &local_cd0;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_e00,
                   (iterator)
                   local_e00.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
      }
      else {
        *local_e00.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_cd0;
        local_e00.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e00.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_ac0._0_8_ = &local_110;
      if (local_e00.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_e00.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_e00,
                   (iterator)
                   local_e00.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
      }
      else {
        *local_e00.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_110;
        local_e00.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e00.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_c60,&local_de0);
      local_a0[0].
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0xc;
      local_a0[0].
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0xc;
      local_a0[0].
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0xc;
      local_a0[0].
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)local_ac0;
      ChMatrixCorotation::ComputeCK((ChMatrixConstRef)&local_c60,&local_e00,4,local_a0);
      if ((double *)
          local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] !=
          (double *)0x0) {
        free(*(void **)((long)local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[5] + -8));
      }
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           5.92878775009496e-323;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           5.92878775009496e-323;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           5.92878775009496e-323;
      local_c8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0xc;
      local_c8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0xc;
      local_c8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0xc;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_ac0;
      local_c8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)local_640;
      ChMatrixCorotation::ComputeKCt((ChMatrixConstRef)&local_c60,&local_e00,4,&local_c8);
      if ((double *)
          local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] !=
          (double *)0x0) {
        free(*(void **)((long)local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[5] + -8));
      }
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           *(double *)paVar34;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           *(double *)(paVar34 + 0x18);
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           5.92878775009496e-323;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           5.92878775009496e-323;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (double)paVar34;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
      local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
      if (((long)*(double *)(paVar34 + 8) < 0xc) || ((long)*(double *)(paVar34 + 0x10) < 0xc))
      goto LAB_00670c01;
      local_c80.m_dst = (DstEvaluatorType *)&local_d70;
      local_c80.m_src = (SrcEvaluatorType *)&local_d40;
      local_c80.m_functor = (add_assign_op<double,_double> *)&local_d90;
      local_d70.m_data =
           (double *)
           local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_d70.m_cols =
           (Index)local_c60.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6];
      local_d40.m_data = (double *)local_640;
      local_c80.m_dstExpr = (DstXprType *)&local_c60;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)(local_c88 + 8));
      if (local_e00.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e00.
                        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e00.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e00.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00670af9;
    }
LAB_00670cf0:
    pcVar31 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
    ;
LAB_00670d05:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar31);
  }
  local_d70.m_data = (double *)0x0;
  local_d70.m_rows = 0;
  local_d70.m_cols = 0;
  local_da9._1_8_ = Kfactor;
  local_da9._17_8_ = Rfactor;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_d70,0x90,0xc,0xc);
  local_de0.m_data = (double *)0x0;
  local_de0.m_rows = 0;
  local_de0.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_de0,0x90,0xc,0xc);
  ChMatrix33<double>::ChMatrix33(&local_170,&this->q_element_abs_rot);
  psVar12 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar13 = (psVar12->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var14 = (psVar12->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
    }
  }
  auVar43 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
  auVar15 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
  auVar71 = vpermpd_avx2(auVar43,1);
  auVar52._0_8_ = *(ulong *)&peVar13->field_0x40 ^ 0x8000000000000000;
  auVar52._8_8_ = *(ulong *)&peVar13->field_0x48 ^ 0x8000000000000000;
  auVar52._16_8_ = 0x8000000000000000;
  auVar52._24_8_ = 0x8000000000000000;
  uVar62 = *(ulong *)&peVar13->field_0x50 ^ 0x8000000000000000;
  auVar65._24_8_ = 0x8000000000000000;
  auVar65._16_8_ = uVar62;
  auVar16 = vpermpd_avx2(auVar52,0xd0);
  auVar79._8_8_ = uVar62;
  auVar79._0_8_ = uVar62;
  auVar79._16_8_ = uVar62;
  auVar79._24_8_ = uVar62;
  auVar65._0_16_ = *(undefined1 (*) [16])&peVar13->field_0x48;
  auVar58._16_8_ = *(ulong *)&peVar13->field_0x40;
  auVar58._0_16_ = *(undefined1 (*) [16])&peVar13->field_0x48;
  auVar58._24_8_ = 0;
  auVar52 = vpermpd_avx2(auVar52,0x11);
  auVar16 = vblendpd_avx(auVar16,ZEXT832(*(ulong *)&peVar13->field_0x40),1);
  auVar16 = vblendpd_avx(auVar16,auVar79,8);
  auVar65 = vpermpd_avx2(auVar65,0x24);
  auVar52 = vshufpd_avx(auVar58,auVar52,9);
  auVar75._0_8_ = auVar71._0_8_ * auVar16._0_8_;
  auVar75._8_8_ = auVar71._8_8_ * auVar16._8_8_;
  auVar75._16_8_ = auVar71._16_8_ * auVar16._16_8_;
  auVar75._24_8_ = auVar71._24_8_ * auVar16._24_8_;
  uVar3 = *(undefined8 *)&peVar13->field_0x38;
  auVar16._8_8_ = uVar3;
  auVar16._0_8_ = uVar3;
  auVar16._16_8_ = uVar3;
  auVar16._24_8_ = uVar3;
  auVar43 = vfmadd231pd_avx512vl(auVar75,auVar43,auVar16);
  dVar2 = (this->q_element_abs_rot).m_data[2];
  auVar71._8_8_ = dVar2;
  auVar71._0_8_ = dVar2;
  dVar2 = (this->q_element_abs_rot).m_data[1];
  auVar71._24_8_ = dVar2;
  auVar71._16_8_ = dVar2;
  auVar17 = vfmadd213pd_fma(auVar71,auVar65,auVar43);
  auVar17 = vfmadd213pd_fma(auVar52,auVar15,ZEXT1632(auVar17));
  local_ac0._0_8_ = auVar17._0_8_;
  local_ac0._8_8_ = auVar17._8_8_;
  sStack_ab0.m_other = 0.0;
  sStack_aa8.m_other = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_110,(ChQuaternion<double> *)local_ac0);
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  psVar12 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar13 = psVar12[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var14 = psVar12[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
    }
  }
  auVar43 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
  auVar15 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
  auVar71 = vpermpd_avx2(auVar43,1);
  auVar53._0_8_ = *(ulong *)&peVar13->field_0x40 ^ 0x8000000000000000;
  auVar53._8_8_ = *(ulong *)&peVar13->field_0x48 ^ 0x8000000000000000;
  auVar53._16_8_ = 0x8000000000000000;
  auVar53._24_8_ = 0x8000000000000000;
  uVar62 = *(ulong *)&peVar13->field_0x50 ^ 0x8000000000000000;
  auVar66._24_8_ = 0x8000000000000000;
  auVar66._16_8_ = uVar62;
  auVar16 = vpermpd_avx2(auVar53,0xd0);
  auVar80._8_8_ = uVar62;
  auVar80._0_8_ = uVar62;
  auVar80._16_8_ = uVar62;
  auVar80._24_8_ = uVar62;
  auVar66._0_16_ = *(undefined1 (*) [16])&peVar13->field_0x48;
  auVar59._16_8_ = *(ulong *)&peVar13->field_0x40;
  auVar59._0_16_ = *(undefined1 (*) [16])&peVar13->field_0x48;
  auVar59._24_8_ = 0;
  auVar52 = vpermpd_avx2(auVar53,0x11);
  auVar16 = vblendpd_avx(auVar16,ZEXT832(*(ulong *)&peVar13->field_0x40),1);
  auVar16 = vblendpd_avx(auVar16,auVar80,8);
  auVar65 = vpermpd_avx2(auVar66,0x24);
  auVar52 = vshufpd_avx(auVar59,auVar52,9);
  auVar76._0_8_ = auVar71._0_8_ * auVar16._0_8_;
  auVar76._8_8_ = auVar71._8_8_ * auVar16._8_8_;
  auVar76._16_8_ = auVar71._16_8_ * auVar16._16_8_;
  auVar76._24_8_ = auVar71._24_8_ * auVar16._24_8_;
  uVar3 = *(undefined8 *)&peVar13->field_0x38;
  auVar20._8_8_ = uVar3;
  auVar20._0_8_ = uVar3;
  auVar20._16_8_ = uVar3;
  auVar20._24_8_ = uVar3;
  auVar43 = vfmadd231pd_avx512vl(auVar76,auVar43,auVar20);
  dVar2 = (this->q_element_abs_rot).m_data[2];
  auVar72._8_8_ = dVar2;
  auVar72._0_8_ = dVar2;
  dVar2 = (this->q_element_abs_rot).m_data[1];
  auVar72._24_8_ = dVar2;
  auVar72._16_8_ = dVar2;
  auVar17 = vfmadd213pd_fma(auVar72,auVar65,auVar43);
  auVar17 = vfmadd213pd_fma(auVar52,auVar15,ZEXT1632(auVar17));
  local_ac0._0_8_ = auVar17._0_8_;
  local_ac0._8_8_ = auVar17._8_8_;
  sStack_ab0.m_other = 0.0;
  sStack_aa8.m_other = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_c60,(ChQuaternion<double> *)local_ac0);
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  local_e00.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
  local_e00.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e00.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
  local_ac0._0_8_ = &local_170;
  std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
  _M_realloc_insert<chrono::ChMatrix33<double>*>
            ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
             &local_e00,(iterator)0x0,(ChMatrix33<double> **)local_ac0);
  if (local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_ac0._0_8_ = &local_110;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_e00,
               (iterator)
               local_e00.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
  }
  else {
    *local_e00.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = &local_110;
    local_e00.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_e00.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_ac0._0_8_ = &local_170;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_e00,
               (iterator)
               local_e00.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
  }
  else {
    *local_e00.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = &local_170;
    local_e00.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_e00.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_ac0._0_8_ = &local_c60;
  if (local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e00.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_e00,
               (iterator)
               local_e00.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)local_ac0);
  }
  else {
    *local_e00.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = &local_c60;
    local_e00.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_e00.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (this->use_geometric_stiffness == true) {
    iVar28 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(this);
    local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_cd0,(long)iVar28);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
              (this,(assign_op<double,_double> *)&local_cd0);
    CVar26 = _local_640;
    vVar7.m_value =
         (long)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_data;
    paVar34 = (assign_op<double,_double> *)
              (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_cols;
    if ((long)paVar34 < 0 &&
        (assign_op<double,_double> *)vVar7.m_value != (assign_op<double,_double> *)0x0) {
      pcVar31 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
      ;
      goto LAB_00670d5a;
    }
    if ((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        < 1) {
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                   );
    }
    if (paVar34 !=
        (assign_op<double,_double> *)
        local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    local_ac0._8_8_ = vVar7.m_value;
    sStack_aa8.m_other = (double)paVar34;
    pCStack_aa0 = &this->Km;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0
    ;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
         (Index)paVar34;
    local_d28._0_8_ = (ChMatrix33<double> *)(local_d28 + 8);
    paStack_a78 = (assign_op<double,_double> *)&local_cd0;
    if (paVar34 == (assign_op<double,_double> *)0x0) {
      local_d28._8_8_ = (ChMatrixConstRef)0x0;
    }
    else {
      if ((long)paVar34 < 1) {
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      local_640._16_8_ = vVar7.m_value;
      paStack_620 = paVar34;
      _paStack_610 = CVar26._48_16_;
      eStack_618.m_d.data =
           (plainobjectbase_evaluator_data<double,_0>)
           (plainobjectbase_evaluator_data<double,_0>)
           local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_d28._8_8_ =
           Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
           ::
           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_640,(scalar_sum_op<double,_double> *)(local_c88 + 8),
                      (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_ac0);
    }
    CVar26 = _local_640;
    pDVar8 = (DstXprType *)
             (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_cols;
    vVar7.m_value =
         (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows;
    if ((long)((ulong)pDVar8 | vVar7.m_value) < 0) goto LAB_00670cf0;
    local_640._0_8_ = &this->Km;
    local_640._16_8_ = vVar7.m_value;
    local_640._24_8_ = pDVar8;
    paStack_620 = (assign_op<double,_double> *)
                  (((Matrix<double,_3,_3,_1,_3,_3> *)local_d28._0_8_)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.
                  array[0];
    _paStack_610 = CVar26._48_16_;
    eStack_618.m_d.data =
         (plainobjectbase_evaluator_data<double,_0>)
         (plainobjectbase_evaluator_data<double,_0>)&this->Kg;
    if (((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows != vVar7.m_value) ||
       ((DstXprType *)
        (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        != pDVar8)) {
      pcVar31 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>]"
      ;
      goto LAB_00670d24;
    }
    local_ac0._0_8_ = (ChMatrix33<double> *)0x0;
    local_ac0._8_8_ = (SrcEvaluatorType *)0x0;
    sStack_ab0.m_other = 0.0;
    sStack_aa8.m_other = 0.0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0
    ;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0
    ;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
              (&MStack_a98,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                *)local_640,(assign_op<double,_double> *)local_d28);
    local_ac0._0_8_ =
         MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_data;
    local_ac0._8_8_ =
         MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows;
    sStack_ab0.m_other =
         (double)MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols;
    if ((MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows | MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols) < 0 &&
        (ChMatrix33<double> *)
        MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
        != (ChMatrix33<double> *)0x0) {
      pcVar31 = 
      "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
      ;
      goto LAB_00670d5a;
    }
    sStack_aa8.m_other =
         (double)MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols;
    local_ae8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = 0;
    local_ae8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = local_d70.m_data;
    local_ae8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = local_d70.m_rows;
    local_ae8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = local_d70.m_cols;
    if (-1 < (local_d70.m_rows | local_d70.m_cols) || local_d70.m_data == (double *)0x0) {
      local_ae8.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = local_d70.m_cols;
      ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_ac0,&local_e00,4,&local_ae8);
      pCVar29 = (ChMatrix33<double> *)
                local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [0];
      if ((ChMatrix33<double> *)
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data != (ChMatrix33<double> *)0x0) {
        free(*(void **)((long)MStack_a98.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + -8));
        pCVar29 = (ChMatrix33<double> *)
                  local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0];
      }
      goto LAB_0066f1e7;
    }
  }
  else {
    local_ac0._0_8_ = (ChMatrix33<double> *)0x0;
    local_ac0._8_8_ = (assign_op<double,_double> *)0x0;
    sStack_ab0.m_other = 0.0;
    sStack_aa8.m_other = 0.0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0
    ;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0
    ;
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)local_ac0,
               &this->Km);
    local_b10.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = 0;
    local_b10.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = local_d70.m_data;
    local_b10.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value = local_d70.m_rows;
    local_b10.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = local_d70.m_cols;
    if (-1 < (local_d70.m_rows | local_d70.m_cols) || local_d70.m_data == (double *)0x0) {
      local_b10.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = local_d70.m_cols;
      ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_ac0,&local_e00,4,&local_b10);
      pCVar29 = (ChMatrix33<double> *)
                MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data;
LAB_0066f1e7:
      if (pCVar29 != (ChMatrix33<double> *)0x0) {
        free((void *)pCVar29[-1].super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8]);
      }
      local_ac0._0_8_ = (ChMatrix33<double> *)0x0;
      local_ac0._8_8_ = (assign_op<double,_double> *)0x0;
      sStack_ab0.m_other = 0.0;
      sStack_aa8.m_other = 0.0;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
           0;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
           0;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)local_ac0
                 ,&local_d70);
      local_b38.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      local_b38.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = local_de0.m_data;
      local_b38.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = local_de0.m_rows;
      local_b38.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = local_de0.m_cols;
      if (-1 < (local_de0.m_rows | local_de0.m_cols) ||
          (assign_op<double,_double> *)local_de0.m_data == (assign_op<double,_double> *)0x0) {
        local_b38.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = local_de0.m_cols;
        ChMatrixCorotation::ComputeKCt((ChMatrixConstRef)local_ac0,&local_e00,4,&local_b38);
        if ((ChMatrix33<double> *)
            MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_data != (ChMatrix33<double> *)0x0) {
          free(*(void **)((long)MStack_a98.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                m_storage.m_data + -8));
        }
        if (this->force_symmetric_stiffness == true) {
          lVar42 = 1;
          pCVar29 = (ChMatrix33<double> *)0x1;
          if (1 < local_de0.m_rows) {
            pCVar29 = (ChMatrix33<double> *)local_de0.m_rows;
          }
          if (pCVar29 != (ChMatrix33<double> *)0x1) {
            lVar37 = 8;
            puVar39 = (undefined1 *)0x0;
            lVar33 = local_de0.m_cols * 8 + 8;
            lVar36 = local_de0.m_cols * 8;
            pCVar30 = (ChMatrix33<double> *)local_de0.m_rows;
            do {
              pCVar30 = (ChMatrix33<double> *)
                        ((long)pCVar30[-1].super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x47);
              puVar39 = puVar39 + 1;
              if ((long)puVar39 < local_de0.m_cols) {
                pCVar41 = (ChMatrix33<double> *)0x0;
                paVar34 = (assign_op<double,_double> *)((long)local_de0.m_data + lVar36);
                do {
                  if (pCVar30 == pCVar41) goto LAB_00670b20;
                  uVar3 = *(undefined8 *)paVar34;
                  pMVar23 = &pCVar41->super_Matrix<double,_3,_3,_1,_3,_3>;
                  paVar34 = paVar34 + local_de0.m_cols * 8;
                  *(undefined8 *)((long)local_de0.m_data + (long)pCVar41 * 8 + lVar37) = uVar3;
                  pCVar41 = (ChMatrix33<double> *)
                            ((long)(pCVar41->super_Matrix<double,_3,_3,_1,_3,_3>).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 1);
                } while ((long)((long)(pMVar23->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                                      m_storage.m_data.array + lVar42 + 1) < local_de0.m_cols);
              }
              lVar42 = lVar42 + 1;
              lVar37 = lVar37 + lVar33;
              lVar36 = lVar36 + lVar33;
            } while (puVar39 !=
                     (undefined1 *)
                     ((long)pCVar29[-1].super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x47));
          }
        }
        local_d40.m_data = (double *)0x0;
        local_d40.m_rows = 0;
        local_d40.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_d40,0x90,0xc,0xc);
        local_d90.m_data = (double *)0x0;
        local_d90.m_rows = 0;
        local_d90.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_d90,0x90,0xc,0xc);
        pCVar24 = local_dc0;
        local_ac0._0_8_ = (ChMatrix33<double> *)0x0;
        local_ac0._8_8_ = (assign_op<double,_double> *)0x0;
        sStack_ab0.m_other = 0.0;
        sStack_aa8.m_other = 0.0;
        MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
             = 0;
        MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
             = (double *)0x0;
        MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
             = 0;
        Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
        construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   local_ac0,&local_dc0->Rm);
        local_b60.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_b60.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = local_d40.m_data;
        local_b60.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = local_d40.m_rows;
        local_b60.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = local_d40.m_cols;
        if (-1 < (local_d40.m_rows | local_d40.m_cols) || local_d40.m_data == (double *)0x0) {
          local_b60.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = local_d40.m_cols;
          ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_ac0,&local_e00,4,&local_b60);
          if ((ChMatrix33<double> *)
              MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_data != (ChMatrix33<double> *)0x0) {
            free(*(void **)((long)MStack_a98.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                  m_storage.m_data + -8));
          }
          local_ac0._0_8_ = (ChMatrix33<double> *)0x0;
          local_ac0._8_8_ = (assign_op<double,_double> *)0x0;
          sStack_ab0.m_other = 0.0;
          sStack_aa8.m_other = 0.0;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols = 0;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data = (double *)0x0;
          MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows = 0;
          Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
          construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                     local_ac0,&local_d40);
          local_b88.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 0;
          local_b88.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = local_d90.m_data;
          local_b88.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value = local_d90.m_rows;
          local_b88.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = local_d90.m_cols;
          if (-1 < (local_d90.m_rows | local_d90.m_cols) ||
              (assign_op<double,_double> *)local_d90.m_data == (assign_op<double,_double> *)0x0) {
            local_b88.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = local_d90.m_cols;
            ChMatrixCorotation::ComputeKCt((ChMatrixConstRef)local_ac0,&local_e00,4,&local_b88);
            if ((ChMatrix33<double> *)
                MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data != (ChMatrix33<double> *)0x0) {
              free(*(void **)((long)MStack_a98.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                    .m_storage.m_data + -8));
            }
            CVar26 = _local_640;
            this = local_dc0;
            if (pCVar24->force_symmetric_stiffness == true) {
              lVar42 = 1;
              pCVar29 = (ChMatrix33<double> *)0x1;
              if (1 < local_d90.m_rows) {
                pCVar29 = (ChMatrix33<double> *)local_d90.m_rows;
              }
              if (pCVar29 != (ChMatrix33<double> *)0x1) {
                lVar37 = 8;
                puVar39 = (undefined1 *)0x0;
                lVar33 = local_d90.m_cols * 8 + 8;
                lVar36 = local_d90.m_cols * 8;
                pCVar30 = (ChMatrix33<double> *)local_d90.m_rows;
                do {
                  pCVar30 = (ChMatrix33<double> *)
                            ((long)pCVar30[-1].super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 0x47);
                  puVar39 = puVar39 + 1;
                  if ((long)puVar39 < local_d90.m_cols) {
                    pCVar41 = (ChMatrix33<double> *)0x0;
                    paVar34 = (assign_op<double,_double> *)((long)local_d90.m_data + lVar36);
                    do {
                      if (pCVar30 == pCVar41) {
LAB_00670b20:
                        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                                     );
                      }
                      uVar3 = *(undefined8 *)paVar34;
                      pMVar23 = &pCVar41->super_Matrix<double,_3,_3,_1,_3,_3>;
                      paVar34 = paVar34 + local_d90.m_cols * 8;
                      *(undefined8 *)((long)local_d90.m_data + (long)pCVar41 * 8 + lVar37) = uVar3;
                      pCVar41 = (ChMatrix33<double> *)
                                ((long)(pCVar41->super_Matrix<double,_3,_3,_1,_3,_3>).
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data.array + 1);
                    } while ((long)((long)(pMVar23->
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                          ).m_storage.m_data.array + lVar42 + 1) < local_d90.m_cols)
                    ;
                  }
                  lVar42 = lVar42 + 1;
                  lVar37 = lVar37 + lVar33;
                  lVar36 = lVar36 + lVar33;
                } while (puVar39 !=
                         (undefined1 *)
                         ((long)pCVar29[-1].super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 0x47));
              }
            }
            if (((local_de0.m_cols | local_de0.m_rows) < 0) ||
               ((local_d90.m_cols | local_d90.m_rows) < 0)) goto LAB_00670cf0;
            if ((local_de0.m_rows != local_d90.m_rows) || (local_de0.m_cols != local_d90.m_cols)) {
              pcVar31 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>>]"
              ;
LAB_00670d24:
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar31);
            }
            local_640._0_16_ = CONCAT88(0xc,*(ChMatrix33<double> **)local_db8);
            local_640._0_24_ = CONCAT816(0xc,local_640._0_16_);
            local_640 = CONCAT824(local_db8,local_640._0_24_);
            _local_640 = (evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          )ZEXT3248(local_640);
            dStack_608 = CVar26._56_8_;
            paStack_610 = *(assign_op<double,_double> **)(local_db8 + 0x18);
            if (((long)*(double *)(local_db8 + 8) < 0xc) ||
               ((long)*(double *)(local_db8 + 0x10) < 0xc)) goto LAB_00670c01;
            sStack_ab0.m_other = (double)local_de0.m_data;
            sStack_aa8.m_other = (double)local_de0.m_cols;
            pCStack_aa0 = (ChMatrixDynamic<> *)local_da9._1_8_;
            MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols = (Index)local_d90.m_data;
            local_a80 = (assign_op<double,_double> *)local_de0.m_cols;
            paStack_a78 = (assign_op<double,_double> *)local_da9._17_8_;
            if (((ChMatrix33<double> *)local_de0.m_rows != (ChMatrix33<double> *)0xc) ||
               ((assign_op<double,_double> *)local_de0.m_cols != (assign_op<double,_double> *)0xc))
            {
              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                            "void Eigen::DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>]"
                           );
            }
            local_d28._0_8_ = &local_cd0;
            local_d10 = (DstXprType *)local_640;
            local_d18 = (assign_op<double,_double> *)(local_c88 + 8);
            local_d28._8_8_ = (ChMatrixConstRef)local_ac0;
            local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)*(ChMatrix33<double> **)local_db8;
            local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
                 (double)*(assign_op<double,_double> **)(local_db8 + 0x18);
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)local_d28);
            peVar35 = (this->tapered_section).
                      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            if ((peVar35->compute_inertia_damping_matrix != false) ||
               (peVar35->compute_inertia_stiffness_matrix == true)) {
              memset(local_640,0,0x480);
              psVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_d50 = (assign_op<double,_double> *)(this->super_ChElementBeam).length;
              peVar13 = (psVar12->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              p_Var14 = (psVar12->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWvel_loc
                        ((ChFrameMoving<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18);
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
              }
              psVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar13 = (psVar12->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              p_Var14 = (psVar12->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWacc_loc
                        ((ChFrameMoving<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18);
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
              }
              psVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar13 = (psVar12->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              p_Var14 = (psVar12->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                }
              }
              psVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar9 = (psVar12->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              p_Var10 = (psVar12->
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                }
              }
              dVar2 = *(double *)&peVar9->field_0xe0;
              auVar63._8_8_ = *(undefined8 *)&peVar9->field_0xd8;
              auVar63._0_8_ = *(undefined8 *)&peVar9->field_0xd8;
              auVar69._8_8_ = *(undefined8 *)&peVar9->field_0xe8;
              auVar69._0_8_ = *(undefined8 *)&peVar9->field_0xe8;
              auVar48._0_8_ = dVar2 * *(double *)&peVar13->field_0x70;
              auVar48._8_8_ = dVar2 * *(double *)&peVar13->field_0x78;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = *(ulong *)&peVar13->field_0x68;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = dVar2 * *(double *)&peVar13->field_0x80;
              auVar56 = vfmadd231sd_fma(auVar56,auVar63,auVar17);
              auVar17 = vfmadd231pd_fma(auVar48,auVar63,*(undefined1 (*) [16])&peVar13->field_0x58);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)&peVar13->field_0x98;
              auVar4 = vfmadd231sd_fma(auVar56,auVar69,auVar4);
              local_bd0 = vfmadd231pd_fma(auVar17,auVar69,*(undefined1 (*) [16])&peVar13->field_0x88
                                         );
              local_bc0 = auVar4._0_8_;
              if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
              }
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
              }
              psVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar13 = psVar12[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var14 = psVar12[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWvel_loc
                        ((ChFrameMoving<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18);
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
              }
              psVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar13 = psVar12[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var14 = psVar12[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWacc_loc
                        ((ChFrameMoving<double> *)&(peVar13->super_ChNodeFEAbase).field_0x18);
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
              }
              psVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar13 = psVar12[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var14 = psVar12[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
                }
              }
              psVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              peVar9 = psVar12[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              p_Var10 = psVar12[1].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                }
              }
              dVar2 = *(double *)&peVar9->field_0xe0;
              auVar64._8_8_ = *(undefined8 *)&peVar9->field_0xd8;
              auVar64._0_8_ = *(undefined8 *)&peVar9->field_0xd8;
              auVar70._8_8_ = *(undefined8 *)&peVar9->field_0xe8;
              auVar70._0_8_ = *(undefined8 *)&peVar9->field_0xe8;
              auVar49._0_8_ = dVar2 * *(double *)&peVar13->field_0x70;
              auVar49._8_8_ = dVar2 * *(double *)&peVar13->field_0x78;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)&peVar13->field_0x68;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = dVar2 * *(double *)&peVar13->field_0x80;
              auVar4 = vfmadd231sd_fma(auVar57,auVar64,auVar5);
              auVar17 = vfmadd231pd_fma(auVar49,auVar64,*(undefined1 (*) [16])&peVar13->field_0x58);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)&peVar13->field_0x98;
              auVar4 = vfmadd231sd_fma(auVar4,auVar70,auVar6);
              local_bf0 = vfmadd231pd_fma(auVar17,auVar70,*(undefined1 (*) [16])&peVar13->field_0x88
                                         );
              local_be0 = auVar4._0_8_;
              if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
              }
              if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
              }
              peVar35 = (this->tapered_section).
                        super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              local_d50 = (assign_op<double,_double> *)((double)local_d50 * 0.5);
              if (peVar35->compute_inertia_damping_matrix == true) {
                (*peVar35->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[3])
                          (peVar35,local_ac0,local_ba0,local_bb8);
                auVar50._8_8_ = 0;
                auVar50._0_8_ = (double)local_d50 * (double)local_da9._17_8_;
                auVar44 = vbroadcastsd_avx512f(auVar50);
                auVar45._8_8_ = local_ac0._8_8_;
                auVar45._0_8_ = local_ac0._0_8_;
                auVar45._16_8_ = sStack_ab0.m_other;
                auVar45._24_8_ = sStack_aa8.m_other;
                auVar45._32_8_ = pCStack_aa0;
                auVar45._40_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_data;
                auVar45._48_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
                auVar45._56_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols;
                auVar45 = vmulpd_avx512f(auVar44,auVar45);
                auVar46._8_8_ = paStack_a78;
                auVar46._0_8_ = local_a80;
                auVar46._16_48_ = auStack_a70;
                auVar46 = vmulpd_avx512f(auVar44,auVar46);
                auVar47 = vmulpd_avx512f(auVar44,local_a40);
                _local_640 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                              )vaddpd_avx512f(auVar45,(undefined1  [64])_local_640);
                local_600 = vaddpd_avx512f(auVar46,local_600);
                auVar45 = vmulpd_avx512f(auVar44,local_a00);
                local_5c0 = vaddpd_avx512f(auVar47,local_5c0);
                auVar46 = vmulpd_avx512f(auVar44,local_9c0);
                local_580 = vaddpd_avx512f(auVar45,local_580);
                auVar45 = vmulpd_avx512f(auVar44,local_980);
                local_540 = vaddpd_avx512f(auVar46,local_540);
                auVar46 = vmulpd_avx512f(auVar44,local_940);
                local_500 = vaddpd_avx512f(auVar45,local_500);
                auVar45 = vmulpd_avx512f(auVar44,local_900);
                local_4c0 = vaddpd_avx512f(auVar46,local_4c0);
                auVar46 = vmulpd_avx512f(auVar44,local_8c0);
                local_480 = vaddpd_avx512f(auVar45,local_480);
                auVar45 = vmulpd_avx512f(auVar44,local_880);
                local_440 = vaddpd_avx512f(auVar46,local_440);
                auVar46 = vmulpd_avx512f(auVar44,local_840);
                local_400 = vaddpd_avx512f(auVar45,local_400);
                auVar45 = vmulpd_avx512f(auVar44,local_800);
                local_3c0 = vaddpd_avx512f(auVar46,local_3c0);
                auVar46 = vmulpd_avx512f(auVar44,local_7c0);
                local_380 = vaddpd_avx512f(auVar45,local_380);
                auVar45 = vmulpd_avx512f(auVar44,local_780);
                local_340 = vaddpd_avx512f(auVar46,local_340);
                auVar46 = vmulpd_avx512f(auVar44,local_740);
                local_300 = vaddpd_avx512f(auVar45,local_300);
                auVar45 = vmulpd_avx512f(auVar44,local_700);
                local_2c0 = vaddpd_avx512f(auVar46,local_2c0);
                auVar46 = vmulpd_avx512f(auVar44,local_6c0);
                auVar44 = vmulpd_avx512f(auVar44,_local_680);
                local_280 = vaddpd_avx512f(auVar45,local_280);
                local_240 = vaddpd_avx512f(auVar46,local_240);
                local_200 = vaddpd_avx512f(auVar44,local_200);
                peVar35 = (local_dc0->tapered_section).
                          super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
              }
              paVar34 = local_db8;
              if (peVar35->compute_inertia_stiffness_matrix == true) {
                (*peVar35->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[4])
                          (peVar35,local_ac0,local_ba0,local_bb8,local_bd0,local_188,local_128,
                           local_bf0);
                auVar51._8_8_ = 0;
                auVar51._0_8_ = (double)local_d50 * (double)local_da9._1_8_;
                auVar45 = vbroadcastsd_avx512f(auVar51);
                auVar44._8_8_ = local_ac0._8_8_;
                auVar44._0_8_ = local_ac0._0_8_;
                auVar44._16_8_ = sStack_ab0.m_other;
                auVar44._24_8_ = sStack_aa8.m_other;
                auVar44._32_8_ = pCStack_aa0;
                auVar44._40_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_data;
                auVar44._48_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
                auVar44._56_8_ =
                     MStack_a98.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols;
                auVar46 = vmulpd_avx512f(auVar45,auVar44);
                auVar47._8_8_ = paStack_a78;
                auVar47._0_8_ = local_a80;
                auVar47._16_48_ = auStack_a70;
                auVar44 = vmulpd_avx512f(auVar45,auVar47);
                auVar47 = vmulpd_avx512f(auVar45,local_a40);
                _local_640 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                              )vaddpd_avx512f(auVar46,(undefined1  [64])_local_640);
                local_600 = vaddpd_avx512f(auVar44,local_600);
                auVar46 = vmulpd_avx512f(auVar45,local_a00);
                local_5c0 = vaddpd_avx512f(auVar47,local_5c0);
                auVar44 = vmulpd_avx512f(auVar45,local_9c0);
                local_580 = vaddpd_avx512f(auVar46,local_580);
                auVar46 = vmulpd_avx512f(auVar45,local_980);
                local_540 = vaddpd_avx512f(auVar44,local_540);
                auVar44 = vmulpd_avx512f(auVar45,local_940);
                local_500 = vaddpd_avx512f(auVar46,local_500);
                auVar46 = vmulpd_avx512f(auVar45,local_900);
                local_4c0 = vaddpd_avx512f(auVar44,local_4c0);
                auVar44 = vmulpd_avx512f(auVar45,local_8c0);
                local_480 = vaddpd_avx512f(auVar46,local_480);
                auVar46 = vmulpd_avx512f(auVar45,local_880);
                local_440 = vaddpd_avx512f(auVar44,local_440);
                auVar44 = vmulpd_avx512f(auVar45,local_840);
                local_400 = vaddpd_avx512f(auVar46,local_400);
                auVar46 = vmulpd_avx512f(auVar45,local_800);
                local_3c0 = vaddpd_avx512f(auVar44,local_3c0);
                auVar44 = vmulpd_avx512f(auVar45,local_7c0);
                local_380 = vaddpd_avx512f(auVar46,local_380);
                auVar46 = vmulpd_avx512f(auVar45,local_780);
                local_340 = vaddpd_avx512f(auVar44,local_340);
                auVar44 = vmulpd_avx512f(auVar45,local_740);
                local_300 = vaddpd_avx512f(auVar46,local_300);
                auVar46 = vmulpd_avx512f(auVar45,local_700);
                local_2c0 = vaddpd_avx512f(auVar44,local_2c0);
                auVar44 = vmulpd_avx512f(auVar45,local_6c0);
                auVar45 = vmulpd_avx512f(auVar45,_local_680);
                local_280 = vaddpd_avx512f(auVar46,local_280);
                local_240 = vaddpd_avx512f(auVar44,local_240);
                local_200 = vaddpd_avx512f(auVar45,local_200);
              }
              pCVar24 = local_dc0;
              this = local_dc0;
              if ((local_dc0->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (local_dc0->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                pCVar38 = (ChMatrixDynamic<> *)0x18;
                uVar62 = 0;
                do {
                  paVar25 = local_db8;
                  lVar42 = uVar62 * 6 + 6;
                  if (((long)*(double *)(paVar34 + 8) < lVar42) ||
                     ((long)*(double *)(paVar34 + 0x10) < lVar42)) {
LAB_00670b41:
                    pcVar31 = 
                    "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 3, InnerPanel = false]"
                    ;
                    goto LAB_00670b79;
                  }
                  lVar33 = uVar62 * 6 + 3;
                  dVar2 = *(double *)(paVar34 + 0x18);
                  pdVar32 = (double *)(*(long *)paVar34 + 0x10 + ((long)dVar2 + 1) * (long)pCVar38);
                  lVar36 = 0x148;
                  do {
                    dVar22 = *(double *)(local_680 + lVar36 + 0x38);
                    pdVar32[-2] = *(double *)(local_680 + lVar36 + 0x30) + pdVar32[-2];
                    pdVar32[-1] = dVar22 + pdVar32[-1];
                    pdVar1 = (double *)(local_640 + lVar36);
                    lVar36 = lVar36 + 0x60;
                    *pdVar32 = *pdVar1 + *pdVar32;
                    pdVar32 = pdVar32 + (long)dVar2;
                  } while (lVar36 != 0x268);
                  local_da9._1_8_ = pCVar38;
                  if (((long)*(double *)(local_db8 + 8) < lVar33) ||
                     ((long)*(double *)(local_db8 + 0x10) < lVar42)) goto LAB_00670b41;
                  dVar2 = *(double *)(local_db8 + 0x18);
                  lVar42 = *(long *)local_db8;
                  local_d28._8_8_ = local_640 + 0x18;
                  local_c80.m_src = (SrcEvaluatorType *)local_d28;
                  local_d10 = (DstXprType *)local_640;
                  local_d08 = 0.0;
                  local_d00 = 1.48219693752374e-323;
                  local_cf8 = 5.92878775009496e-323;
                  local_d28._0_8_ =
                       &((pCVar24->nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar62].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
                  local_c80.m_dst = (DstEvaluatorType *)(&local_cd0 + 1);
                  local_c88 = (undefined1  [8])&local_cd0;
                  local_cd8 = 3;
                  local_c80.m_functor = (add_assign_op<double,_double> *)local_da9;
                  local_cf0 = (ChMatrix33<double> *)local_d28._0_8_;
                  local_ce8 = (ChMatrixConstRef)local_d28._8_8_;
                  local_c80.m_dstExpr = (DstXprType *)local_c88;
                  Eigen::internal::
                  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)(local_c88 + 8));
                  pdVar32 = (double *)(lVar33 * 8 + lVar42 + uVar62 * 6 * (long)dVar2 * 8);
                  dVar2 = *(double *)(paVar25 + 0x18);
                  uVar62 = uVar62 + 1;
                  pCVar38 = (ChMatrixDynamic<> *)(local_da9._1_8_ + 0x30);
                  *pdVar32 = local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[0] + *pdVar32;
                  pdVar32[1] = local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[3] + pdVar32[1];
                  pdVar32[2] = local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6] + pdVar32[2];
                  pdVar32[(long)dVar2] =
                       local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1] + pdVar32[(long)dVar2];
                  pdVar32[(long)dVar2 + 1] =
                       local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4] + pdVar32[(long)dVar2 + 1];
                  pdVar32[(long)dVar2 + 2] =
                       local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[7] + pdVar32[(long)dVar2 + 2];
                  pdVar32[(long)dVar2 * 2] =
                       local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[2] + pdVar32[(long)dVar2 * 2];
                  pdVar32[(long)dVar2 * 2 + 1] =
                       local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5] + pdVar32[(long)dVar2 * 2 + 1];
                  pdVar32[(long)dVar2 * 2 + 2] =
                       local_cd0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8] + pdVar32[(long)dVar2 * 2 + 2];
                  paVar34 = paVar25;
                  this = local_dc0;
                } while (uVar62 < (ulong)((long)(pCVar24->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pCVar24->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4));
              }
            }
            if ((assign_op<double,_double> *)local_d90.m_data != (assign_op<double,_double> *)0x0) {
              free(*(void **)((long)local_d90.m_data + -8));
            }
            if (local_d40.m_data != (double *)0x0) {
              free((void *)local_d40.m_data[-1]);
            }
            if (local_e00.
                super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e00.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_e00.
                                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e00.
                                    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((assign_op<double,_double> *)local_de0.m_data != (assign_op<double,_double> *)0x0) {
              free(*(void **)((long)local_de0.m_data + -8));
            }
            if (local_d70.m_data != (double *)0x0) {
              free((void *)local_d70.m_data[-1]);
            }
            goto LAB_006700eb;
          }
        }
      }
    }
  }
  pcVar31 = 
  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
  ;
LAB_00670d5a:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar31);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeKRMmatricesGlobal(ChMatrixRef H,
                                                              double Kfactor,
                                                              double Rfactor,
                                                              double Mfactor) {
    assert((H.rows() == 12) && (H.cols() == 12));
    assert(tapered_section);

    //
    // The K stiffness matrix and R damping matrix of this element:
    //

    if (Kfactor || Rfactor) {
        // Corotational K stiffness:
        ChMatrixDynamic<> CK(12, 12);
        ChMatrixDynamic<> CKCt(12, 12);  // the global, corotated, K matrix

        //
        // Corotate local stiffness matrix
        //

        ChMatrix33<> Atoabs(this->q_element_abs_rot);
        ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        std::vector<ChMatrix33<>*> R;
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelA);
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelB);

        if (this->use_geometric_stiffness) {
            // compute Px tension of the beam along centerline, using temporary but fast data structures:
            ChVectorDynamic<> displ(this->GetNdofs());
            this->GetStateBlock(displ);
            double Px = -this->Km.row(0) * displ;
            // ChVector<> mFo, mTo;
            // this->EvaluateSectionForceTorque(0, mFo, mTo);  // for double checking the Px value
            // GetLog() << "   Px = " << Px << "  Px_eval = " << mFo.x() << " \n";

            // corotate Km + Kg  (where Kg = this->Kg * Px)
            ChMatrixCorotation::ComputeCK(this->Km + Px * this->Kg, R, 4, CK);
        } else {
            ChMatrixCorotation::ComputeCK(this->Km, R, 4, CK);
        }
        ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

        // For strict symmetry, copy L=U because the computations above might
        // lead to small errors because of numerical roundoff even with force_symmetric_stiffness
        if (force_symmetric_stiffness) {
            for (int row = 0; row < CKCt.rows() - 1; ++row)
                for (int col = row + 1; col < CKCt.cols(); ++col)
                    CKCt(row, col) = CKCt(col, row);
        }

        //// RADU
        //// Check if the above can be done with the one-liner:
        ////CKCt.triangularView<Eigen::Upper>() = CKCt.transpose();

        // The code below may be quite slow!!
        ChMatrixDynamic<> CR(12, 12);
        ChMatrixDynamic<> CRCt(12, 12);  // the global, corotated, R matrix
        ChMatrixCorotation::ComputeCK(this->Rm, R, 4, CR);
        ChMatrixCorotation::ComputeKCt(CR, R, 4, CRCt);
        if (force_symmetric_stiffness) {
            for (int row = 0; row < CRCt.rows() - 1; ++row)
                for (int col = row + 1; col < CRCt.cols(); ++col)
                    CRCt(row, col) = CRCt(col, row);
        }

        //// For K stiffness matrix and R matrix: scale by factors
        // CKCt *= Kfactor + Rfactor * this->tapered_section->GetBeamRaleyghDamping();

        H.block(0, 0, 12, 12) = CKCt * Kfactor + CRCt * Rfactor;

        // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping),
        // if enabled in this beam element.
        // These matrices are not symmetric. Also note.
        if (this->tapered_section->compute_inertia_damping_matrix ||
            this->tapered_section->compute_inertia_stiffness_matrix) {
            ChMatrixNM<double, 12, 12> matr_loc;
            ChMatrixNM<double, 12, 12> KRi_loc;
            KRi_loc.setZero();
            // A lumped version of the inertial damping/stiffness matrix computation is used here, on a per-node basis:
            double node_multiplier_fact_R = 0.5 * length * Rfactor;
            double node_multiplier_fact_K = 0.5 * length * Kfactor;

            ///< current angular velocity of section of node A, in material frame
            ChVector<> mWvel_A = this->GetNodeA()->GetWvel_loc();
            ///< current angular acceleration of section of node A, in material frame
            ChVector<> mWacc_A = this->GetNodeA()->GetWacc_loc();
            ///< current acceleration of section of node A, in material frame)
            ChVector<> mXacc_A = this->GetNodeA()->TransformDirectionParentToLocal(this->GetNodeA()->GetPos_dtdt());
            ///< current angular velocity of section of node B, in material frame
            ChVector<> mWvel_B = this->GetNodeB()->GetWvel_loc();
            ///< current angular acceleration of section of node B, in material frame
            ChVector<> mWacc_B = this->GetNodeB()->GetWacc_loc();
            ///< current acceleration of section of node B, in material frame
            ChVector<> mXacc_B = this->GetNodeB()->TransformDirectionParentToLocal(this->GetNodeB()->GetPos_dtdt());

            if (this->tapered_section->compute_inertia_damping_matrix) {
                this->tapered_section->ComputeInertiaDampingMatrix(matr_loc, mWvel_A, mWacc_A);
                KRi_loc += matr_loc * node_multiplier_fact_R;
                // check the inertial damping matrix, it should be skew symmetric
                // if ((matr_loc + matr_loc.transpose()).norm() < 1E-9) {
                //    std::cout << "Gyroscopic damping matrix is skew symmetric, that's correct！" << std::endl;
                //} else {
                //    std::cout << "Gyroscopic damping matrix is NOT skew symmetric, something is wrong!" << std::endl;
                //}
            }

            if (this->tapered_section->compute_inertia_stiffness_matrix) {
                this->tapered_section->ComputeInertiaStiffnessMatrix(matr_loc, mWvel_A, mWacc_A, mXacc_A, mWvel_B,
                                                                     mWacc_B, mXacc_B);
                KRi_loc += matr_loc * node_multiplier_fact_K;
                // check the inertial stiffness matrix, is it must be skew symmetric as the stiffness matrix?
                // if ((matr_loc + matr_loc.transpose()).norm() < 1E-9) {
                //    std::cout << "Inertial stiffness matrix is skew symmetric" << std::endl;
                //} else {
                //    std::cout << "Inertial stiffness matrix is NOT skew symmetric" << std::endl;
                //}
            }

            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
                // H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) *
                // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by
                // construction
                H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
                H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
                // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) *
                // (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by
                // construction
            }
        }
    } else
        H.setZero();

    //
    // The M mass matrix of this element:
    //

    if (Mfactor) {
        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        // ChMatrixNM<double, 12, 12> sectional_mass = this->M;  // it could be consistent mass matrix, depends on
        // SetLumpedMassMatrix(true/false)

        if (this->tapered_section->GetLumpedMassMatrixType()) {
            double node_multiplier_fact = 0.5 * this->length * Mfactor;
            for (int i = 0; i < nodes.size(); ++i) {
                int stride = i * 6;
                // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
                // hence it can be the simple (constant) expression
                //   Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
                // but the more general case needs the rotations, hence:
                Mloc.block<3, 3>(stride, stride) += this->M.block<3, 3>(stride, stride) * node_multiplier_fact;
                Mloc.block<3, 3>(stride + 3, stride + 3) +=
                    this->M.block<3, 3>(stride + 3, stride + 3) * node_multiplier_fact;
                Mxw = nodes[i]->GetA() * this->M.block<3, 3>(stride, stride + 3) * node_multiplier_fact;
                Mloc.block<3, 3>(stride, stride + 3) += Mxw;
                Mloc.block<3, 3>(stride + 3, stride) += Mxw.transpose();
            }
            // ..rather do this because lumped mass matrix does not need rotation transf.
            H.block(0, 0, 12, 12) += Mloc;

        } else {
            Mloc = this->M * Mfactor;

            // The following would be needed if consistent mass matrix is used, but...
            ChMatrix33<> Atoabs(this->q_element_abs_rot);
            ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            std::vector<ChMatrix33<>*> R;
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelA);
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelB);

            ChMatrixNM<double, 12, 12> CK;
            ChMatrixNM<double, 12, 12> CKCt;
            ChMatrixCorotation::ComputeCK(Mloc, R, 4, CK);
            ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

            H.block(0, 0, 12, 12) += CKCt;
        }

        //// TODO better per-node lumping, or 4x4 consistent mass matrices, maybe with integration if not uniform
        // materials.
    }
}